

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O3

int STATE_checkers_and_pinners
              (chess_state_t *s,bitboard_t *block_check,bitboard_t *pinners,bitboard_t *pinned)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bitboard_t *pbVar10;
  ulong uVar11;
  bool bVar12;
  
  bVar1 = s->player;
  uVar6 = (ulong)bVar1;
  uVar4 = uVar6 ^ 1;
  lVar2 = 0;
  if (s->bitboard[uVar6 * 7 + 5] != 0) {
    for (; (s->bitboard[uVar6 * 7 + 5] >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
    }
  }
  *block_check = 0;
  *pinners = 0;
  *pinned = 0;
  uVar7 = (ulong)(uint)((int)lVar2 * 8);
  uVar8 = s->bitboard[uVar4 * 7 + 1] & *(ulong *)((long)bitboard_knight + uVar7) |
          s->bitboard[uVar4 * 7] & *(ulong *)((long)bitboard_pawn_capture[bVar1] + uVar7);
  uVar7 = (s->bitboard[uVar4 * 7 + 4] | s->bitboard[uVar4 * 7 + 3]) &
          *(ulong *)((long)bitboard_rook + uVar7) |
          (s->bitboard[uVar4 * 7 + 2] | s->bitboard[uVar4 * 7 + 4]) &
          *(ulong *)((long)bitboard_bishop + uVar7);
  if (uVar7 != 0) {
    do {
      lVar3 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
        }
      }
      uVar11 = 1L << ((byte)lVar3 & 0x3f);
      uVar5 = *(ulong *)((long)bitboard_between[0] + lVar2 * 8 + (ulong)(uint)((int)lVar3 << 9));
      if ((s->bitboard[uVar4 * 7 + 6] & uVar5) == 0) {
        uVar9 = s->bitboard[uVar6 * 7 + 6] & uVar5;
        if (uVar9 == 0) {
          uVar8 = uVar8 | uVar11;
          pbVar10 = block_check;
        }
        else {
          if ((uVar9 ^ uVar9 - 1) <= uVar9 - 1) goto LAB_001073c9;
          *pinners = *pinners | uVar11;
          uVar5 = uVar9;
          pbVar10 = pinned;
        }
        *pbVar10 = *pbVar10 | uVar5;
      }
LAB_001073c9:
      bVar12 = uVar11 != uVar7;
      uVar7 = uVar11 ^ uVar7;
    } while (bVar12);
  }
  *block_check = *block_check | uVar8;
  uVar8 = uVar8 - (uVar8 >> 1 & 0x5555555555555555);
  uVar4 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
  return (int)(byte)(((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
}

Assistant:

int STATE_checkers_and_pinners(const chess_state_t *s, bitboard_t *block_check, bitboard_t *pinners, bitboard_t *pinned)
{
    const int player = s->player;
    const int opponent = player ^ 1;
    const bitboard_t * player_bb = &s->bitboard[player * NUM_TYPES];
    const bitboard_t * opponent_bb = &s->bitboard[opponent * NUM_TYPES];
    int king_pos = BITBOARD_find_bit(player_bb[KING]);
    bitboard_t checkers = 0;
    *block_check = 0;
    *pinners = 0;
    *pinned = 0;

    /* Attacking pawns */
    checkers |= bitboard_pawn_capture[player][king_pos] & opponent_bb[PAWN];

    /* Attacking knights */
    checkers |= bitboard_knight[king_pos] & opponent_bb[KNIGHT];

    /* Attacking sliders */
    bitboard_t attackers = (bitboard_bishop[king_pos] & (opponent_bb[BISHOP] | opponent_bb[QUEEN])) |
                           (bitboard_rook[king_pos] & (opponent_bb[ROOK] | opponent_bb[QUEEN]));
    while(attackers) {
        int attack_pos = BITBOARD_find_bit(attackers);
        bitboard_t attacker_bb = BITBOARD_POSITION(attack_pos);
        bitboard_t between = bitboard_between[attack_pos][king_pos];
        bitboard_t own_between = between & player_bb[ALL];
        bitboard_t opponent_between = between & opponent_bb[ALL];

        if(opponent_between == 0) {
            if(own_between == 0) {
                /* Slider is checking */
                checkers |= attacker_bb;
                *block_check |= between;
            } else if(BITBOARD_count_bits(own_between) == 1) {
                /* Slider is pinning */
                *pinners |= attacker_bb;
                *pinned |= own_between;
            }
        }

        attackers ^= attacker_bb;
    }

    *block_check |= checkers;

    /* Return number of checkers */
    return BITBOARD_count_bits(checkers);
}